

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImGui::ScaleValueFromRatioT<int,int,float>
              (ImGuiDataType data_type,float t,int v_min,int v_max,bool is_logarithmic,
              float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined1 in_register_00001244 [60];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001484 [12];
  undefined1 local_18 [16];
  
  auVar5._4_60_ = in_register_00001244;
  auVar5._0_4_ = logarithmic_zero_epsilon;
  if (v_max - v_min == 0) {
    return v_min;
  }
  local_18 = auVar5._0_16_;
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) != 8) {
      if (1.0 <= t) {
        return v_max;
      }
      return v_min + (int)((float)(v_max - v_min) * t +
                          *(float *)(&DAT_001ee9d0 + (ulong)(v_max < v_min) * 4));
    }
    fVar3 = (float)(v_max - v_min) * t + (float)v_min;
    goto LAB_00182766;
  }
  if (t <= 0.0) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  auVar12._0_8_ = CONCAT44(in_register_00001244._0_4_,logarithmic_zero_epsilon) ^ 0x8000000080000000
  ;
  auVar12._8_4_ = in_register_00001244._4_4_ ^ 0x80000000;
  auVar12._12_4_ = in_register_00001244._8_4_ ^ 0x80000000;
  auVar8 = auVar12;
  if (-1 < v_min) {
    auVar8 = local_18;
  }
  auVar9 = auVar12;
  if (-1 < v_max) {
    auVar9 = local_18;
  }
  auVar6._0_4_ = (float)v_min;
  auVar6._4_12_ = in_ZMM4._4_12_;
  auVar11._8_4_ = 0x7fffffff;
  auVar11._0_8_ = 0x7fffffff7fffffff;
  auVar11._12_4_ = 0x7fffffff;
  auVar2 = vandps_avx(auVar6,auVar11);
  auVar2 = vcmpss_avx(auVar2,local_18,1);
  auVar2 = vblendvps_avx(auVar6,auVar8,auVar2);
  auVar7._0_4_ = (float)v_max;
  auVar7._4_12_ = in_register_00001484;
  auVar8 = vandps_avx(auVar7,auVar11);
  auVar8 = vcmpss_avx(auVar8,local_18,1);
  auVar8 = vblendvps_avx(auVar7,auVar9,auVar8);
  auVar9 = auVar2;
  if (v_max < v_min) {
    t = 1.0 - t;
    auVar9 = auVar8;
    auVar8 = auVar2;
  }
  if (v_max != 0) {
    auVar12 = auVar8;
  }
  if (-1 < v_min) {
    auVar12 = auVar8;
  }
  fVar10 = auVar9._0_4_;
  fVar3 = auVar12._0_4_;
  if (v_max * v_min < 0) {
    if (v_min < v_max) {
      v_max = v_min;
    }
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx(ZEXT416((uint)(auVar7._0_4_ - auVar6._0_4_)),auVar8);
    fVar4 = -(float)v_max / auVar8._0_4_;
    fVar1 = fVar4 + zero_deadzone_halfsize;
    if ((fVar4 - zero_deadzone_halfsize <= t) && (t <= fVar1)) {
      return 0;
    }
    if (fVar4 <= t) {
      fVar3 = fVar3 / logarithmic_zero_epsilon;
      t = (t - fVar1) / (1.0 - fVar1);
      goto LAB_0018275c;
    }
    fVar3 = powf(-fVar10 / logarithmic_zero_epsilon,1.0 - t / (fVar4 - zero_deadzone_halfsize));
    fVar3 = -fVar3;
  }
  else {
    if ((v_max | v_min) < 0) {
      fVar3 = fVar10 / fVar3;
      t = 1.0 - t;
      local_18 = auVar12;
    }
    else {
      fVar3 = fVar3 / fVar10;
      local_18 = auVar9;
    }
LAB_0018275c:
    fVar3 = powf(fVar3,t);
  }
  fVar3 = fVar3 * (float)local_18._0_4_;
LAB_00182766:
  return (int)fVar3;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}